

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

Ref __thiscall
wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::
ExpressionProcessor::makeSetVar(wasm::Expression*,wasm::Expression*,wasm::Name,wasm::NameScope_
          (void *this,Expression *curr,Expression *value,Name name,NameScope scope)

{
  size_t sVar1;
  Ref this_00;
  Ref RVar2;
  Ref RVar3;
  Ref right;
  IString name_00;
  IString IVar4;
  IString op;
  undefined8 local_58;
  NameScope scope_local;
  Expression *value_local;
  Expression *curr_local;
  ExpressionProcessor *this_local;
  Name name_local;
  
  right.inst = name.super_IString.str._M_str;
  IVar4 = fromName(wasm::Name,wasm::NameScope_(this,name,scope);
  name_00.str._M_str = IVar4.str._M_str;
  local_58 = (ValueBuilder *)IVar4.str._M_len;
  name_00.str._M_len = (size_t)name_00.str._M_str;
  this_00 = cashew::ValueBuilder::makeName(local_58,name_00);
  sVar1 = BLOCK;
  RVar3.inst = cashew::SET.inst;
  IVar4.str._M_str = _realloc;
  IVar4.str._M_len = EXPRESSION_RESULT;
  RVar2 = visit(wasm::Expression*,wasm::IString_(this,value,IVar4);
  op.str._M_str = (char *)RVar2.inst;
  op.str._M_len = sVar1;
  RVar3 = cashew::ValueBuilder::makeBinary(this_00.inst,RVar3,op,right);
  return (Ref)RVar3.inst;
}

Assistant:

Ref makeSetVar(Expression* curr,
                   Expression* value,
                   Name name,
                   NameScope scope) {
      return ValueBuilder::makeBinary(
        ValueBuilder::makeName(fromName(name, scope)),
        SET,
        visit(value, EXPRESSION_RESULT));
    }